

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exception.hpp
# Opt level: O0

char * __thiscall jsoncons::not_an_object::what(not_an_object *this)

{
  ulong uVar1;
  long in_RDI;
  undefined8 local_8;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_8 = (char *)std::__cxx11::string::c_str();
  }
  else {
    std::runtime_error::what();
    std::__cxx11::string::append((char *)(in_RDI + 0x30));
    std::__cxx11::string::append((char *)(in_RDI + 0x30));
    std::__cxx11::string::append((string *)(in_RDI + 0x30));
    std::__cxx11::string::append((char *)(in_RDI + 0x30));
    local_8 = (char *)std::__cxx11::string::c_str();
  }
  return local_8;
}

Assistant:

const char* what() const noexcept override
        {
            if (what_.empty())
            {
                JSONCONS_TRY
                {
                    what_.append(std::runtime_error::what());
                    what_.append(": '");
                    what_.append(name_);
                    what_.append("'");
                    return what_.c_str();
                }
                JSONCONS_CATCH(...)
                {
                    return std::runtime_error::what();
                }
            }